

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MergedDescriptorDatabaseTest::MergedDescriptorDatabaseTest
          (MergedDescriptorDatabaseTest *this)

{
  MergedDescriptorDatabaseTest *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__MergedDescriptorDatabaseTest_029a4a28;
  SimpleDescriptorDatabase::SimpleDescriptorDatabase(&this->database1_);
  SimpleDescriptorDatabase::SimpleDescriptorDatabase(&this->database2_);
  MergedDescriptorDatabase::MergedDescriptorDatabase
            (&this->forward_merged_,&(this->database1_).super_DescriptorDatabase,
             &(this->database2_).super_DescriptorDatabase);
  MergedDescriptorDatabase::MergedDescriptorDatabase
            (&this->reverse_merged_,&(this->database2_).super_DescriptorDatabase,
             &(this->database1_).super_DescriptorDatabase);
  return;
}

Assistant:

MergedDescriptorDatabaseTest()
      : forward_merged_(&database1_, &database2_),
        reverse_merged_(&database2_, &database1_) {}